

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QTabBarPrivate::Tab_*>::move(QList<QTabBarPrivate::Tab_*> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *in_RDI;
  Tab **unaff_retaddr;
  Tab **b;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QTabBarPrivate::Tab_*> *)0x6b63fa);
    QArrayDataPointer<QTabBarPrivate::Tab_*>::operator->(in_RDI);
    QArrayDataPointer<QTabBarPrivate::Tab_*>::begin
              ((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6b640b);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QTabBarPrivate::Tab**>(b,unaff_retaddr,(Tab **)__last);
    }
    else {
      std::_V2::rotate<QTabBarPrivate::Tab**>(b,unaff_retaddr,(Tab **)__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }